

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::convertToSignExtendedInteger
          (IEEEFloat *this,MutableArrayRef<unsigned_long> parts,uint width,bool isSigned,
          roundingMode rounding_mode,bool *isExact)

{
  bool bVar1;
  uint dstCount;
  uint uVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  integerPart *src_00;
  WordType WVar5;
  uint uVar6;
  uint omsb;
  uint bits;
  uint truncatedBits;
  uint dstPartsCount;
  integerPart *src;
  lostFraction lost_fraction;
  roundingMode rounding_mode_local;
  bool isSigned_local;
  uint width_local;
  IEEEFloat *this_local;
  MutableArrayRef<unsigned_long> parts_local;
  
  parts_local.super_ArrayRef<unsigned_long>.Data =
       (unsigned_long *)parts.super_ArrayRef<unsigned_long>.Length;
  this_local = (IEEEFloat *)parts.super_ArrayRef<unsigned_long>.Data;
  *isExact = false;
  if (((this->field_0x12 & 7) == 0) || ((this->field_0x12 & 7) == 1)) {
    parts_local.super_ArrayRef<unsigned_long>.Length._4_4_ = opInvalidOp;
  }
  else {
    dstCount = partCountForBits(width);
    sVar3 = ArrayRef<unsigned_long>::size((ArrayRef<unsigned_long> *)&this_local);
    if (sVar3 < dstCount) {
      __assert_fail("dstPartsCount <= parts.size() && \"Integer too big\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x802,
                    "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertToSignExtendedInteger(MutableArrayRef<integerPart>, unsigned int, bool, roundingMode, bool *) const"
                   );
    }
    if ((this->field_0x12 & 7) == 3) {
      puVar4 = MutableArrayRef<unsigned_long>::data((MutableArrayRef<unsigned_long> *)&this_local);
      APInt::tcSet(puVar4,0,dstCount);
      *isExact = (bool)((((byte)this->field_0x12 >> 3 & 1) != 0 ^ 0xffU) & 1);
      parts_local.super_ArrayRef<unsigned_long>.Length._4_4_ = opOK;
    }
    else {
      src_00 = significandParts(this);
      if (this->exponent < 0) {
        puVar4 = MutableArrayRef<unsigned_long>::data((MutableArrayRef<unsigned_long> *)&this_local)
        ;
        APInt::tcSet(puVar4,0,dstCount);
        omsb = (this->semantics->precision - 1) - (int)this->exponent;
      }
      else {
        uVar2 = (int)this->exponent + 1;
        if (width < uVar2) {
          return opInvalidOp;
        }
        if (uVar2 < this->semantics->precision) {
          omsb = this->semantics->precision - uVar2;
          puVar4 = MutableArrayRef<unsigned_long>::data
                             ((MutableArrayRef<unsigned_long> *)&this_local);
          APInt::tcExtract(puVar4,dstCount,src_00,uVar2,omsb);
        }
        else {
          puVar4 = MutableArrayRef<unsigned_long>::data
                             ((MutableArrayRef<unsigned_long> *)&this_local);
          APInt::tcExtract(puVar4,dstCount,src_00,this->semantics->precision,0);
          puVar4 = MutableArrayRef<unsigned_long>::data
                             ((MutableArrayRef<unsigned_long> *)&this_local);
          APInt::tcShiftLeft(puVar4,dstCount,uVar2 - this->semantics->precision);
          omsb = 0;
        }
      }
      if (omsb == 0) {
        src._0_4_ = lfExactlyZero;
      }
      else {
        uVar2 = partCount(this);
        src._0_4_ = lostFractionThroughTruncation(src_00,uVar2,omsb);
        if (((lostFraction)src != lfExactlyZero) &&
           (bVar1 = roundAwayFromZero(this,rounding_mode,(lostFraction)src,omsb), bVar1)) {
          puVar4 = MutableArrayRef<unsigned_long>::data
                             ((MutableArrayRef<unsigned_long> *)&this_local);
          WVar5 = APInt::tcIncrement(puVar4,dstCount);
          if (WVar5 != 0) {
            return opInvalidOp;
          }
        }
      }
      puVar4 = MutableArrayRef<unsigned_long>::data((MutableArrayRef<unsigned_long> *)&this_local);
      uVar2 = APInt::tcMSB(puVar4,dstCount);
      uVar6 = uVar2 + 1;
      if (((byte)this->field_0x12 >> 3 & 1) == 0) {
        if (width + ((isSigned ^ 0xffU) & 1) <= uVar6) {
          return opInvalidOp;
        }
      }
      else {
        if (isSigned) {
          if (uVar6 == width) {
            puVar4 = MutableArrayRef<unsigned_long>::data
                               ((MutableArrayRef<unsigned_long> *)&this_local);
            uVar2 = APInt::tcLSB(puVar4,dstCount);
            if (uVar2 + 1 != uVar6) {
              return opInvalidOp;
            }
          }
          if (width < uVar6) {
            return opInvalidOp;
          }
        }
        else if (uVar2 != 0xffffffff) {
          return opInvalidOp;
        }
        puVar4 = MutableArrayRef<unsigned_long>::data((MutableArrayRef<unsigned_long> *)&this_local)
        ;
        APInt::tcNegate(puVar4,dstCount);
      }
      if ((lostFraction)src == lfExactlyZero) {
        *isExact = true;
        parts_local.super_ArrayRef<unsigned_long>.Length._4_4_ = opOK;
      }
      else {
        parts_local.super_ArrayRef<unsigned_long>.Length._4_4_ = opInexact;
      }
    }
  }
  return parts_local.super_ArrayRef<unsigned_long>.Length._4_4_;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::convertToSignExtendedInteger(
    MutableArrayRef<integerPart> parts, unsigned int width, bool isSigned,
    roundingMode rounding_mode, bool *isExact) const {
  lostFraction lost_fraction;
  const integerPart *src;
  unsigned int dstPartsCount, truncatedBits;

  *isExact = false;

  /* Handle the three special cases first.  */
  if (category == fcInfinity || category == fcNaN)
    return opInvalidOp;

  dstPartsCount = partCountForBits(width);
  assert(dstPartsCount <= parts.size() && "Integer too big");

  if (category == fcZero) {
    APInt::tcSet(parts.data(), 0, dstPartsCount);
    // Negative zero can't be represented as an int.
    *isExact = !sign;
    return opOK;
  }

  src = significandParts();

  /* Step 1: place our absolute value, with any fraction truncated, in
     the destination.  */
  if (exponent < 0) {
    /* Our absolute value is less than one; truncate everything.  */
    APInt::tcSet(parts.data(), 0, dstPartsCount);
    /* For exponent -1 the integer bit represents .5, look at that.
       For smaller exponents leftmost truncated bit is 0. */
    truncatedBits = semantics->precision -1U - exponent;
  } else {
    /* We want the most significant (exponent + 1) bits; the rest are
       truncated.  */
    unsigned int bits = exponent + 1U;

    /* Hopelessly large in magnitude?  */
    if (bits > width)
      return opInvalidOp;

    if (bits < semantics->precision) {
      /* We truncate (semantics->precision - bits) bits.  */
      truncatedBits = semantics->precision - bits;
      APInt::tcExtract(parts.data(), dstPartsCount, src, bits, truncatedBits);
    } else {
      /* We want at least as many bits as are available.  */
      APInt::tcExtract(parts.data(), dstPartsCount, src, semantics->precision,
                       0);
      APInt::tcShiftLeft(parts.data(), dstPartsCount,
                         bits - semantics->precision);
      truncatedBits = 0;
    }
  }

  /* Step 2: work out any lost fraction, and increment the absolute
     value if we would round away from zero.  */
  if (truncatedBits) {
    lost_fraction = lostFractionThroughTruncation(src, partCount(),
                                                  truncatedBits);
    if (lost_fraction != lfExactlyZero &&
        roundAwayFromZero(rounding_mode, lost_fraction, truncatedBits)) {
      if (APInt::tcIncrement(parts.data(), dstPartsCount))
        return opInvalidOp;     /* Overflow.  */
    }
  } else {
    lost_fraction = lfExactlyZero;
  }

  /* Step 3: check if we fit in the destination.  */
  unsigned int omsb = APInt::tcMSB(parts.data(), dstPartsCount) + 1;

  if (sign) {
    if (!isSigned) {
      /* Negative numbers cannot be represented as unsigned.  */
      if (omsb != 0)
        return opInvalidOp;
    } else {
      /* It takes omsb bits to represent the unsigned integer value.
         We lose a bit for the sign, but care is needed as the
         maximally negative integer is a special case.  */
      if (omsb == width &&
          APInt::tcLSB(parts.data(), dstPartsCount) + 1 != omsb)
        return opInvalidOp;

      /* This case can happen because of rounding.  */
      if (omsb > width)
        return opInvalidOp;
    }

    APInt::tcNegate (parts.data(), dstPartsCount);
  } else {
    if (omsb >= width + !isSigned)
      return opInvalidOp;
  }

  if (lost_fraction == lfExactlyZero) {
    *isExact = true;
    return opOK;
  } else
    return opInexact;
}